

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O1

EnumValue *
google::protobuf::util::converter::FindEnumValueByNumberOrNull(Enum *enum_type,int32 value)

{
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  Type *unaff_RBX;
  int iVar4;
  
  if (enum_type != (Enum *)0x0) {
    iVar4 = (enum_type->enumvalue_).super_RepeatedPtrFieldBase.current_size_;
    bVar2 = 0 < iVar4;
    if (0 < iVar4) {
      pTVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
                         (&(enum_type->enumvalue_).super_RepeatedPtrFieldBase,0);
      unaff_RBX = pTVar3;
      if (pTVar3->number_ != value) {
        iVar4 = 1;
        do {
          iVar1 = (enum_type->enumvalue_).super_RepeatedPtrFieldBase.current_size_;
          bVar2 = iVar4 < iVar1;
          unaff_RBX = pTVar3;
          if (iVar1 <= iVar4) break;
          unaff_RBX = protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
                                (&(enum_type->enumvalue_).super_RepeatedPtrFieldBase,iVar4);
          iVar4 = iVar4 + 1;
        } while (unaff_RBX->number_ != value);
      }
    }
    if (bVar2) {
      return unaff_RBX;
    }
  }
  return (EnumValue *)0x0;
}

Assistant:

const google::protobuf::EnumValue* FindEnumValueByNumberOrNull(
    const google::protobuf::Enum* enum_type, int32 value) {
  if (enum_type != nullptr) {
    for (int i = 0; i < enum_type->enumvalue_size(); ++i) {
      const google::protobuf::EnumValue& enum_value = enum_type->enumvalue(i);
      if (enum_value.number() == value) {
        return &enum_value;
      }
    }
  }
  return nullptr;
}